

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O0

void __thiscall
r_exec::MonitoringJob<r_exec::SGMonitor>::report(MonitoringJob<r_exec::SGMonitor> *this,int64_t lag)

{
  DebugStream *pDVar1;
  allocator local_41;
  string local_40 [39];
  string local_19;
  int64_t local_18;
  int64_t lag_local;
  MonitoringJob<r_exec::SGMonitor> *this_local;
  
  local_18 = lag;
  lag_local = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"monitoring job",&local_41);
  ::debug(&local_19);
  pDVar1 = DebugStream::operator<<((DebugStream *)&local_19,"late:");
  pDVar1 = DebugStream::operator<<(pDVar1,local_18);
  DebugStream::operator<<(pDVar1,"us behind.");
  DebugStream::~DebugStream((DebugStream *)&local_19);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void report(int64_t lag) const
    {
        debug("monitoring job") << "late:" << lag << "us behind.";
    }